

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdgeType __thiscall ON_SubDEdge::EdgeType(ON_SubDEdge *this)

{
  bool bVar1;
  ON_SubDEdge *this_local;
  
  if (this->m_face_count == 0) {
    if (this->m_edge_tag == Crease) {
      return Wire;
    }
  }
  else if (this->m_face_count == 1) {
    if (this->m_edge_tag == Crease) {
      return Boundary;
    }
  }
  else if (this->m_face_count == 2) {
    if (this->m_edge_tag == Crease) {
      return InteriorCrease;
    }
    if ((this->m_edge_tag == Smooth) || (this->m_edge_tag == SmoothX)) {
      bVar1 = ON_SubDEdgeSharpness::IsZero(&this->m_sharpness);
      if (bVar1) {
        return InteriorSmooth;
      }
      bVar1 = ON_SubDEdgeSharpness::IsSharp(&this->m_sharpness);
      if (bVar1) {
        return InteriorSharp;
      }
    }
  }
  else if ((this->m_face_count < 0xfff1) && (this->m_edge_tag == Crease)) {
    return Nonmanifold;
  }
  return Invalid;
}

Assistant:

ON_SubDEdgeType ON_SubDEdge::EdgeType() const
{
  if (0 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Wire;
  }
  else if (1 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Boundary;
  }
  else if (2 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::InteriorCrease;
    
    if (ON_SubDEdgeTag::Smooth == m_edge_tag || ON_SubDEdgeTag::SmoothX == m_edge_tag)
    {
      if (this->m_sharpness.IsZero())
        return ON_SubDEdgeType::InteriorSmooth;
      if (this->m_sharpness.IsSharp())
        return ON_SubDEdgeType::InteriorSharp;
    }
  }
  else if (m_face_count <= ON_SubDEdge::MaximumFaceCount)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Nonmanifold;
  }

  return ON_SubDEdgeType::Invalid;
}